

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

bool __thiscall TrodesConfig::isValid(TrodesConfig *this)

{
  bool bVar1;
  size_type sVar2;
  vector<NDevice,_std::allocator<NDevice>_> *in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  while( true ) {
    iVar3 = iVar5;
    sVar2 = std::vector<NDevice,_std::allocator<NDevice>_>::size
                      ((vector<NDevice,_std::allocator<NDevice>_> *)
                       &(in_RDI->super__Vector_base<NDevice,_std::allocator<NDevice>_>)._M_impl.
                        super__Vector_impl_data._M_finish);
    if ((int)sVar2 <= iVar5) {
      iVar3 = 0;
      while( true ) {
        iVar4 = iVar3;
        sVar2 = std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::size
                          ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)
                           &in_RDI[1].super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                            super__Vector_impl_data._M_finish);
        if ((int)sVar2 <= iVar3) {
          return true;
        }
        std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::at
                  ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_RDI,CONCAT44(iVar5,iVar3));
        bVar1 = NTrodeObj::isValid((NTrodeObj *)CONCAT44(iVar5,iVar3));
        if (!bVar1) break;
        iVar3 = iVar4 + 1;
      }
      return false;
    }
    std::vector<NDevice,_std::allocator<NDevice>_>::at
              (in_RDI,CONCAT44(iVar5,in_stack_ffffffffffffffd8));
    bVar1 = NDevice::isValid((NDevice *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    if (!bVar1) break;
    iVar5 = iVar3 + 1;
  }
  return false;
}

Assistant:

bool TrodesConfig::isValid() const {
//    std::cerr << "ISVALID check on TrodesConfig() " << this << "\n";
    // if (devices.empty()){ //there must always at least be an MCU
    //     std::cerr << "NO DEVICES\n";
    //     return(false);
    // }

    for (int i = 0; i < (int)devices.size(); i++) {
        if (!devices.at(i).isValid()){ //check that all devices are valid
            return(false);
        }
    }

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        if (!nTrodes.at(i).isValid()){ //check that all added nTrodes are valid
            return(false);
        }
    }
    return(true);
}